

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assume_value_suite::get_const_map(void)

{
  map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  basic_variable<std::allocator<char>_> *pbVar3;
  mapped_type *pmVar4;
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_380;
  basic_variable<std::allocator<char>_> local_378;
  basic_variable<std::allocator<char>_> local_348;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  basic_variable<std::allocator<char>_> local_2b8;
  basic_variable<std::allocator<char>_> local_288;
  basic_variable<std::allocator<char>_> local_258;
  basic_variable<std::allocator<char>_> local_228;
  map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  *local_1f8;
  map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  *result;
  int local_1e8 [5];
  bool local_1d1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1d0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_168;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_1d0 = &local_1c8;
  local_1d1 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_1d0,(char (*) [6])"alpha",&local_1d1);
  local_1d0 = &local_168;
  local_1e8[0] = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_1d0,(char (*) [6])"bravo",local_1e8);
  local_1d0 = &local_108;
  result = (map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
            *)0x4008000000000000;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>(local_1d0,(char (*) [8])"charlie",(double *)&result);
  local_1d0 = &local_a8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (local_1d0,(char (*) [6])"delta",(char (*) [10])"beryllium");
  local_48._0_8_ = &local_1c8;
  local_48._8_8_ = 4;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_380 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_380 = local_380 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_380);
  } while (local_380 != &local_1c8);
  local_1f8 = trial::dynamic::basic_variable<std::allocator<char>>::
              assume_value<std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                        ((basic_variable<std::allocator<char>> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_228,"alpha");
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_228);
  pmVar1 = local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_258,"alpha");
  pmVar4 = std::
           map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
           ::at(pmVar1,&local_258);
  bVar2 = trial::dynamic::operator==(pbVar3,pmVar4);
  boost::detail::test_impl
            ("data[\"alpha\"] == result.at(\"alpha\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1448,"void assume_value_suite::get_const_map()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_288,"bravo");
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_288);
  pmVar1 = local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2b8,"bravo");
  pmVar4 = std::
           map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
           ::at(pmVar1,&local_2b8);
  bVar2 = trial::dynamic::operator==(pbVar3,pmVar4);
  boost::detail::test_impl
            ("data[\"bravo\"] == result.at(\"bravo\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1449,"void assume_value_suite::get_const_map()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,"charlie");
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_2e8);
  pmVar1 = local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,"charlie");
  pmVar4 = std::
           map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
           ::at(pmVar1,&local_318);
  bVar2 = trial::dynamic::operator==(pbVar3,pmVar4);
  boost::detail::test_impl
            ("data[\"charlie\"] == result.at(\"charlie\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x144a,"void assume_value_suite::get_const_map()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_348,"delta");
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_348);
  pmVar1 = local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_378,"delta");
  pmVar4 = std::
           map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
           ::at(pmVar1,&local_378);
  bVar2 = trial::dynamic::operator==(pbVar3,pmVar4);
  boost::detail::test_impl
            ("data[\"delta\"] == result.at(\"delta\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x144b,"void assume_value_suite::get_const_map()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_348);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void get_const_map()
{
    const variable data = map::make(
        {
            { "alpha", true },
            { "bravo", 2 },
            { "charlie", 3.0 },
            { "delta", "beryllium" }
        });
    const auto& result = data.assume_value<variable::map_type>();
    TRIAL_PROTOCOL_TEST(data["alpha"] == result.at("alpha"));
    TRIAL_PROTOCOL_TEST(data["bravo"] == result.at("bravo"));
    TRIAL_PROTOCOL_TEST(data["charlie"] == result.at("charlie"));
    TRIAL_PROTOCOL_TEST(data["delta"] == result.at("delta"));
}